

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFATokenizer.h
# Opt level: O0

void __thiscall
SGParser::DFATokenizer<SGParser::GenericToken>::DFATokenizer
          (DFATokenizer<SGParser::GenericToken> *this,DFA *pdfa,InputStream *pinputStream)

{
  InputStream *pinputStream_local;
  DFA *pdfa_local;
  DFATokenizer<SGParser::GenericToken> *this_local;
  
  TokenizerImpl<SGParser::GenericToken>::TokenizerImpl
            (&this->super_TokenizerImpl<SGParser::GenericToken>);
  (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenStream<SGParser::GenericToken>.
  _vptr_TokenStream = (_func_int **)&PTR__DFATokenizer_00128c78;
  this->pDFA = (DFA *)0x0;
  this->ExpressionStackTop = 0xffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->ExpressionStack);
  Create(this,pdfa,pinputStream);
  return;
}

Assistant:

explicit DFATokenizer(const DFA* pdfa, InputStream* pinputStream = nullptr) {
        Create(pdfa, pinputStream);
    }